

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int pigpio_start(char *addrStr,char *portStr)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  int *piVar4;
  ssize_t sVar5;
  uint *userdata;
  pthread_t *ppVar6;
  int pi;
  uint pi_00;
  ulong uVar7;
  int cancelState;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar4 = gPiInUse;
  uVar7 = 0;
  do {
    if (*piVar4 == 0) goto LAB_001055a3;
    uVar7 = uVar7 + 1;
    piVar4 = piVar4 + 1;
  } while (uVar7 != 0x20);
  uVar7 = 0x20;
LAB_001055a3:
  pi_00 = (uint)uVar7;
  uVar1 = 0xfffff824;
  if (pi_00 < 0x20) {
    uVar7 = uVar7 & 0xffffffff;
    gPiInUse[uVar7] = 1;
    if (((addrStr == (char *)0x0) || (*addrStr == '\0')) &&
       ((addrStr = getenv("PIGPIO_ADDR"), addrStr == (char *)0x0 || (*addrStr == '\0')))) {
      addrStr = "localhost";
    }
    if (((portStr == (char *)0x0) || (*portStr == '\0')) &&
       ((portStr = getenv("PIGPIO_PORT"), portStr == (char *)0x0 || (*portStr == '\0')))) {
      portStr = "8888";
    }
    __mutex = gCmdMutex + uVar7;
    pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
    uVar1 = pigpioOpenSocket(addrStr,portStr);
    gPigCommand[uVar7] = uVar1;
    if (-1 < (int)uVar1) {
      uVar1 = pigpioOpenSocket(addrStr,portStr);
      gPigNotify[uVar7] = uVar1;
      if (-1 < (int)uVar1) {
        if (gPiInUse[uVar7] == 0) {
          iVar2 = -0x7db;
        }
        else {
          local_48 = 99;
          uStack_40 = 0;
          pthread_setcancelstate(1,&local_4c);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          gCancelState[uVar7] = local_4c;
          sVar5 = send(gPigNotify[uVar7],&local_48,0x10,0);
          if (sVar5 == 0x10) {
            sVar5 = recv(gPigNotify[uVar7],&local_48,0x10,0x100);
            iVar2 = gCancelState[uVar7];
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            pthread_setcancelstate(iVar2,(int *)0x0);
            iVar2 = -0x7d1;
            if (sVar5 == 0x10) {
              iVar2 = uStack_40._4_4_;
            }
          }
          else {
            iVar2 = gCancelState[uVar7];
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            pthread_setcancelstate(iVar2,(int *)0x0);
            iVar2 = -2000;
          }
        }
        gPigHandle[uVar7] = iVar2;
        if (iVar2 < 0) {
          uVar1 = 0xfffff82b;
        }
        else {
          uVar3 = pigpio_command(pi_00,10,0,0,1);
          gLastLevel[uVar7] = uVar3;
          userdata = (uint *)malloc(4);
          *userdata = pi_00;
          ppVar6 = start_thread(pthNotifyThread,userdata);
          gPthNotify[uVar7] = ppVar6;
          uVar1 = 0xfffff827;
          if (ppVar6 != (pthread_t *)0x0) {
            uVar1 = pi_00;
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   int pi;
   int *userdata;

   for (pi=0; pi<MAX_PI; pi++)
   {
      if (!gPiInUse[pi]) break;
   }

   if (pi >= MAX_PI) return pigif_too_many_pis;

   gPiInUse[pi] = 1;

   if ((!addrStr)  || (!strlen(addrStr)))
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }

   if ((!portStr) || (!strlen(portStr)))
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }

   pthread_mutex_init(&gCmdMutex[pi], NULL);

   gPigCommand[pi] = pigpioOpenSocket(addrStr, portStr);

   if (gPigCommand[pi] >= 0)
   {
      gPigNotify[pi] = pigpioOpenSocket(addrStr, portStr);

      if (gPigNotify[pi] >= 0)
      {
         gPigHandle[pi] = pigpio_notify(pi);

         if (gPigHandle[pi] < 0) return pigif_bad_noib;
         else
         {
            gLastLevel[pi] = read_bank_1(pi);

            /* must be freed by pthNotifyThread */
            userdata = malloc(sizeof(*userdata));
            *userdata = pi;

            gPthNotify[pi] = start_thread(pthNotifyThread, userdata);

            if (gPthNotify[pi]) return pi;
            else                return pigif_notify_failed;

         }
      }
      else return gPigNotify[pi];
   }
   else return gPigCommand[pi];
}